

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O3

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,24,24,1,24,24>>
               (Matrix<double,_24,_24,_1,_24,_24> *result,
               ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChQuadratureTables *pCVar4;
  pointer pdVar5;
  long lVar6;
  undefined8 uVar7;
  pointer pdVar8;
  pointer pdVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  ActualDstType actualDst;
  ulong uVar15;
  pointer pvVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  DstEvaluatorType dstEvaluator_1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_24,_24,_1,_24,_24> val;
  mul_assign_op<double,_double> local_1329;
  double local_1328;
  double local_1320;
  double local_1318;
  plainobjectbase_evaluator_data<double,_24> local_1310;
  ChQuadratureTables *local_1308;
  double local_1300;
  double local_12f8;
  double local_12f0;
  pointer local_12e8;
  double local_12e0;
  double local_12d8;
  double local_12d0;
  SrcEvaluatorType local_12c8;
  ulong local_12b8;
  ulong local_12b0;
  ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *local_12a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
  local_12a0;
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  
  local_1280._32_32_ = local_1280._56_32_;
  uVar15 = (ulong)(uint)order;
  local_1328 = Zb;
  local_1320 = Yb;
  local_1318 = Xb;
  local_1300 = Xa;
  local_12f8 = Ya;
  local_12f0 = Za;
  local_12a8 = integrand;
  pCVar4 = GetStaticTables();
  local_12b8 = ((long)(pCVar4->Lroots).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pCVar4->Lroots).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_12b0 = uVar15;
  if (local_12b8 < uVar15) {
    pCVar4 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(pCVar4,order,order);
    ChQuadratureTables::PrintTables(pCVar4);
    local_12e8 = (pCVar4->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pvVar16 = (pCVar4->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1308 = pCVar4;
  }
  else {
    local_1308 = GetStaticTables();
    pvVar16 = (local_1308->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_12e8 = (local_1308->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  local_12a0.m_dst = (DstEvaluatorType *)0x0;
  local_1280._8_8_ = &local_12a0;
  local_1280._0_8_ = &local_12c8;
  local_1280._16_8_ = &local_1310;
  local_1280._24_8_ = result;
  local_12d0 = (local_1318 - local_1300) * 0.5;
  local_12d8 = (local_1320 - local_12f8) * 0.5;
  local_12e0 = (local_1328 - local_12f0) * 0.5;
  auVar21 = ZEXT1664(ZEXT816(0));
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    (result->
                                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                    ).m_storage.m_data.array);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.array
       = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 8));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 8) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x10));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x10) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x18));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x18) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x20));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x20) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x28));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x28) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x30));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x30) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x38));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x38) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x40));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x40) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x48));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x48) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x50));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x50) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x58));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x58) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x60));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x60) = auVar17;
  auVar17 = vmulpd_avx512f(auVar21,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x68));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x68) = auVar17;
  local_12c8.m_functor.m_other = (double)result;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
         *)local_1280);
  pdVar5 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar8 != pdVar5) {
    pvVar14 = (void *)0x0;
    local_1318 = (local_1300 + local_1318) * 0.5;
    local_1320 = (local_12f8 + local_1320) * 0.5;
    local_1328 = (local_12f0 + local_1328) * 0.5;
    do {
      pdVar9 = pdVar5;
      if (pdVar8 != pdVar5) {
        pvVar11 = (void *)0x0;
        do {
          pdVar9 = pdVar8;
          if ((long)pdVar8 - (long)pdVar5 == 0) break;
          pvVar10 = (void *)((long)pdVar8 - (long)pdVar5 >> 3);
          pvVar13 = (void *)0x0;
          do {
            pvVar12 = pvVar14;
            if ((pvVar10 <= pvVar14) || (pvVar12 = pvVar11, pvVar10 <= pvVar11)) {
LAB_006cb60a:
              uVar7 = std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,pvVar12);
              operator_delete(pvVar13,0x30);
              _Unwind_Resume(uVar7);
            }
            auVar18._8_8_ = 0;
            auVar18._0_8_ = pdVar5[(long)pvVar14];
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_1318;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_1320;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = local_1328;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_12d0;
            vfmadd132sd_fma(auVar18,auVar22,auVar1);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = pdVar5[(long)pvVar11];
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_12d8;
            vfmadd132sd_fma(auVar23,auVar24,auVar2);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = pdVar5[(long)pvVar13];
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_12e0;
            vfmadd132sd_fma(auVar25,auVar26,auVar3);
            (*local_12a8->_vptr_ChIntegrable3D[2])(local_12a8,local_1280);
            lVar6 = *(long *)&(local_12e8->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl;
            pvVar10 = (void *)((long)(local_12e8->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - lVar6 >> 3);
            pvVar12 = pvVar14;
            if ((pvVar10 <= pvVar14) ||
               ((pvVar12 = pvVar11, pvVar10 <= pvVar11 || (pvVar12 = pvVar13, pvVar10 <= pvVar13))))
            goto LAB_006cb60a;
            local_1310.data = (double *)local_1280;
            local_12c8.m_functor.m_other =
                 *(double *)(lVar6 + (long)pvVar14 * 8) * *(double *)(lVar6 + (long)pvVar11 * 8) *
                 *(double *)(lVar6 + (long)pvVar13 * 8);
            local_12a0.m_dst = (DstEvaluatorType *)&local_1310;
            local_12a0.m_src = &local_12c8;
            local_12a0.m_functor = &local_1329;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_12c8.m_functor.m_other;
            auVar17 = vbroadcastsd_avx512f(auVar19);
            local_1280 = vmulpd_avx512f(auVar17,local_1280);
            local_1240 = vmulpd_avx512f(auVar17,local_1240);
            local_1200 = vmulpd_avx512f(auVar17,local_1200);
            local_11c0 = vmulpd_avx512f(auVar17,local_11c0);
            local_1180 = vmulpd_avx512f(auVar17,local_1180);
            local_1140 = vmulpd_avx512f(auVar17,local_1140);
            local_1100 = vmulpd_avx512f(auVar17,local_1100);
            local_10c0 = vmulpd_avx512f(auVar17,local_10c0);
            local_1080 = vmulpd_avx512f(auVar17,local_1080);
            local_1040 = vmulpd_avx512f(auVar17,local_1040);
            local_1000 = vmulpd_avx512f(auVar17,local_1000);
            local_fc0 = vmulpd_avx512f(auVar17,local_fc0);
            local_f80 = vmulpd_avx512f(auVar17,local_f80);
            local_f40 = vmulpd_avx512f(auVar17,local_f40);
            local_12a0.m_dstExpr = (DstXprType *)local_1310.data;
            Eigen::internal::
            copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
            ::run(&local_12a0);
            lVar6 = 0x80;
            do {
              auVar17 = vaddpd_avx512f(*(undefined1 (*) [64])((long)&local_1300 + lVar6),
                                       *(undefined1 (*) [64])
                                        ((long)(result->
                                               super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                               ).m_storage.m_data.array + lVar6 + -0x80));
              *(undefined1 (*) [64])
               ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                      m_storage.m_data.array + lVar6 + -0x80) = auVar17;
              auVar17 = vaddpd_avx512f(*(undefined1 (*) [64])(&local_12c8.field_0x8 + lVar6),
                                       *(undefined1 (*) [64])
                                        ((long)(result->
                                               super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                               ).m_storage.m_data.array + lVar6 + -0x40));
              *(undefined1 (*) [64])
               ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                      m_storage.m_data.array + lVar6 + -0x40) = auVar17;
              auVar17 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1280 + lVar6),
                                       *(undefined1 (*) [64])
                                        ((long)(result->
                                               super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                               ).m_storage.m_data.array + lVar6));
              *(undefined1 (*) [64])
               ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).
                      m_storage.m_data.array + lVar6) = auVar17;
              lVar6 = lVar6 + 0xc0;
            } while (lVar6 != 0x1280);
            pdVar8 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pdVar5 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pvVar13 = (void *)(ulong)((int)pvVar13 + 1);
            pvVar10 = (void *)((long)pdVar8 - (long)pdVar5 >> 3);
          } while (pvVar13 < pvVar10);
          pvVar11 = (void *)(ulong)((int)pvVar11 + 1);
          pdVar9 = pdVar8;
        } while (pvVar11 < pvVar10);
      }
      pvVar14 = (void *)(ulong)((int)pvVar14 + 1);
      pdVar8 = pdVar9;
    } while (pvVar14 < (void *)((long)pdVar9 - (long)pdVar5 >> 3));
  }
  local_12a0.m_dst = (DstEvaluatorType *)&local_1310;
  local_12a0.m_src = &local_12c8;
  local_12a0.m_functor = &local_1329;
  local_12c8.m_functor.m_other = local_12d8 * local_12d0 * local_12e0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_12c8.m_functor.m_other;
  auVar17 = vbroadcastsd_avx512f(auVar20);
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    (result->
                                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                    ).m_storage.m_data.array);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.array
       = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 8));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 8) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x10));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x10) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x18));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x18) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x20));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x20) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x28));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x28) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x30));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x30) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x38));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x38) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x40));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x40) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x48));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x48) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x50));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x50) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x58));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x58) = auVar21;
  auVar21 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x60));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x60) = auVar21;
  auVar17 = vmulpd_avx512f(auVar17,*(undefined1 (*) [64])
                                    ((result->
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     ).m_storage.m_data.array + 0x68));
  *(undefined1 (*) [64])
   ((result->super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>).m_storage.m_data.
    array + 0x68) = auVar17;
  local_1310.data = (double *)result;
  local_12a0.m_dstExpr = result;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run(&local_12a0);
  pCVar4 = local_1308;
  if (local_12b8 < local_12b0) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_1308->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&pCVar4->Weight);
    operator_delete(pCVar4,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }